

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

int __thiscall FIX::SessionState::getNextTargetMsgSeqNum(SessionState *this)

{
  int iVar1;
  
  Mutex::lock(&this->m_mutex);
  iVar1 = (*this->m_pStore->_vptr_MessageStore[5])();
  Mutex::unlock(&this->m_mutex);
  return iVar1;
}

Assistant:

int getNextTargetMsgSeqNum() const EXCEPT ( IOException )
  { Locker l( m_mutex ); return m_pStore->getNextTargetMsgSeqNum(); }